

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Convolution::convolve(Convolution *this,double *in,int length)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if (length <= this->m_filter_len) {
    if (0 < length) {
      pdVar4 = this->m_fft_buff;
      uVar8 = 0;
      do {
        pdVar4[uVar8] = in[uVar8];
        uVar8 = uVar8 + 1;
      } while ((uint)length != uVar8);
    }
    iVar3 = this->m_fft_len;
    pdVar4 = this->m_fft_buff;
    if (length < iVar3) {
      memset(pdVar4 + length,0,(ulong)(uint)(~length + iVar3) * 8 + 8);
    }
    rdft(iVar3,1,pdVar4,this->m_ip,this->m_work);
    pdVar4 = this->m_filter;
    pdVar5 = this->m_fft_buff;
    *pdVar5 = *pdVar4 * *pdVar5;
    pdVar5[1] = pdVar4[1] * pdVar5[1];
    iVar3 = this->m_filter_len;
    if (1 < (long)iVar3) {
      lVar9 = 0x10;
      do {
        dVar1 = *(double *)((long)pdVar5 + lVar9);
        dVar2 = *(double *)((long)pdVar5 + lVar9 + 8);
        dVar6 = *(double *)((long)pdVar4 + lVar9);
        dVar7 = ((double *)((long)pdVar4 + lVar9))[1];
        *(double *)((long)pdVar5 + lVar9) = dVar1 * dVar6 + dVar7 * -dVar2;
        ((double *)((long)pdVar5 + lVar9))[1] = dVar1 * dVar7 + dVar6 * dVar2;
        lVar9 = lVar9 + 0x10;
      } while ((long)iVar3 * 0x10 != lVar9);
    }
    rdft(this->m_fft_len,-1,pdVar5,this->m_ip,this->m_work);
    iVar3 = this->m_fft_len;
    if (0 < (long)iVar3) {
      pdVar4 = this->m_fft_buff;
      pdVar5 = this->m_filter_result;
      lVar9 = 0;
      do {
        pdVar5[lVar9] = pdVar4[lVar9] + pdVar5[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar3 != lVar9);
    }
    if (0 < length) {
      pdVar4 = this->m_filter_result;
      uVar8 = 0;
      do {
        in[uVar8] = pdVar4[uVar8];
        uVar8 = uVar8 + 1;
      } while ((uint)length != uVar8);
    }
    lVar9 = (long)this->m_filter_len;
    if (0 < lVar9) {
      pdVar4 = this->m_filter_result;
      lVar10 = 0;
      do {
        pdVar4[lVar10] = pdVar4[lVar9 + lVar10];
        pdVar4[lVar9 + lVar10] = 0.0;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
    return;
  }
  __assert_fail("length <= m_filter_len",
                "/workspace/llm4binary/github/license_c_cmakelists/osoumen[P]dpcmc/main.cpp",0x6c,
                "void Convolution::convolve(double *, int)");
}

Assistant:

void convolve(double *in, int length)
	{
		assert(length <= m_filter_len);
		
		for (int i=0; i<length; ++i) {
			m_fft_buff[i] = in[i];
		}
		for (int i=length; i<m_fft_len; ++i) {
			m_fft_buff[i] = .0;
		}
		rdft(m_fft_len, 1, m_fft_buff, m_ip, m_work);
		m_fft_buff[0] *= m_filter[0];
		m_fft_buff[1] *= m_filter[1];
		for (int i=1; i<m_filter_len; ++i) {
			double realp = m_fft_buff[2*i] * m_filter[2*i] - m_fft_buff[2*i+1] * m_filter[2*i+1];
			double imagp = m_fft_buff[2*i] * m_filter[2*i+1] + m_fft_buff[2*i+1] * m_filter[2*i];
			m_fft_buff[2*i] = realp;
			m_fft_buff[2*i+1] = imagp;
		}
		rdft(m_fft_len, -1, m_fft_buff, m_ip, m_work);
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] += m_fft_buff[i];
		}
		for (int i=0; i<length; ++i) {
			in[i] = m_filter_result[i];
		}
		for (int i=0; i<m_filter_len; ++i) {
			m_filter_result[i] = m_filter_result[i+m_filter_len];
			m_filter_result[i+m_filter_len] = .0;
		}
	}